

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::
format_uint<1u,char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_int>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,uint value,int num_digits,
          bool upper)

{
  type tVar1;
  char *buffer_00;
  byte in_CL;
  int in_EDX;
  uint in_ESI;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_RDI;
  char buffer [33];
  char *ptr;
  char *in_stack_ffffffffffffff98;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_ffffffffffffffa8;
  buffer<char> *local_8;
  
  tVar1 = to_unsigned<int>(in_EDX);
  buffer_00 = to_pointer<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                        (in_RDI,(ulong)tVar1);
  if (buffer_00 == (char *)0x0) {
    format_uint<1u,char,unsigned_int>(&stack0xffffffffffffffa8,in_ESI,in_EDX,(bool)(in_CL & 1));
    local_8 = (buffer<char> *)
              copy_str<char,_char_*,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_0>
                        (in_RDI.container,in_stack_ffffffffffffff98,in_stack_ffffffffffffffa8);
  }
  else {
    format_uint<1u,char,unsigned_int>(buffer_00,in_ESI,in_EDX,(bool)(in_CL & 1));
    local_8 = in_RDI.container;
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_8;
}

Assistant:

inline It format_uint(It out, UInt value, int num_digits, bool upper = false) {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1];
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str<Char>(buffer, buffer + num_digits, out);
}